

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  bool bVar7;
  double *pdVar8;
  double *pdVar9;
  uint uVar10;
  long lVar11;
  int i;
  ulong uVar12;
  value_type vVar13;
  value_type vVar14;
  
  pFVar4 = (fadexpr->fadexpr_).right_;
  uVar2 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  pFVar5 = (pFVar4->fadexpr_).left_;
  uVar3 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  uVar10 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar10 < (int)uVar3) {
    uVar10 = uVar3;
  }
  uVar3 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar10 <= (int)uVar3) {
    uVar10 = uVar3;
  }
  if ((int)uVar10 < (int)uVar2) {
    uVar10 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar10 != uVar2) {
    if (uVar10 == 0) {
      if (uVar2 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar10;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar10) {
        uVar12 = (long)(int)uVar10 << 3;
      }
      pdVar8 = (double *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pdVar8;
    }
  }
  if (uVar10 != 0) {
    pdVar8 = (this->dx_).ptr_to_data;
    bVar7 = FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
            ::hasFastAccess(&fadexpr->fadexpr_);
    if (bVar7) {
      if (0 < (int)uVar10) {
        uVar12 = 0;
        do {
          vVar13 = FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
                   ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar12);
          pdVar8[uVar12] = vVar13;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
    }
    else if (0 < (int)uVar10) {
      i = 0;
      lVar11 = 0;
      do {
        pFVar6 = (fadexpr->fadexpr_).left_;
        pdVar9 = &pFVar6->defaultVal;
        if ((pFVar6->dx_).num_elts != 0) {
          pdVar9 = (double *)((long)(pFVar6->dx_).ptr_to_data + lVar11);
        }
        dVar1 = *pdVar9;
        vVar14 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::dx
                           (&((fadexpr->fadexpr_).right_)->fadexpr_,i);
        *(double *)((long)pdVar8 + lVar11) = vVar14 + dVar1;
        lVar11 = lVar11 + 8;
        i = i + 1;
      } while ((ulong)uVar10 << 3 != lVar11);
    }
  }
  pFVar4 = (fadexpr->fadexpr_).right_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  this->val_ = ((pFVar5->fadexpr_).left_)->val_ * ((pFVar5->fadexpr_).right_)->val_ *
               ((pFVar4->fadexpr_).right_)->val_ + ((fadexpr->fadexpr_).left_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}